

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintInt32_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32_t val)

{
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  int32_t val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._12_4_ = val;
  anon_unknown_1::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintInt32
            (&this->delegate_,generator.output_.field_2._12_4_,(BaseTextGenerator *)local_48);
  (anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_48);
  anon_unknown_1::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintInt32(int32_t val) const {
  FORWARD_IMPL(PrintInt32, val);
}